

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_script.cpp
# Opt level: O0

void __thiscall
cfdcapi_script_TapscriptTreeRestoreFromString_Test::TestBody
          (cfdcapi_script_TapscriptTreeRestoreFromString_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  char *in_R9;
  char *in_stack_000000a0;
  uint8_t in_stack_000000af;
  char *in_stack_000000b0;
  char *in_stack_000000b8;
  void *in_stack_000000c0;
  void *in_stack_000000c8;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  char *str_buffer;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  char *leaf_hash;
  char *tapscript;
  uint8_t leaf_version;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  char *tree_str;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  uint32_t branch_count;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  void *tree_handle1;
  int tmp_ret;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  char *tapscript_str;
  char *exp_tree_str;
  bool *in_stack_fffffffffffffb88;
  AssertionResult *in_stack_fffffffffffffb90;
  CfdErrorCode *in_stack_fffffffffffffb98;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba7;
  void **in_stack_fffffffffffffba8;
  void *in_stack_fffffffffffffbc8;
  char **in_stack_fffffffffffffc20;
  AssertionResult *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  void *in_stack_fffffffffffffc50;
  void *in_stack_fffffffffffffc58;
  void **in_stack_fffffffffffffc70;
  undefined7 in_stack_fffffffffffffc78;
  undefined1 in_stack_fffffffffffffc7f;
  char *in_stack_fffffffffffffc80;
  AssertHelper local_2f8;
  Message local_2f0;
  undefined4 local_2e4;
  AssertionResult local_2e0;
  AssertHelper local_2d0;
  Message local_2c8;
  AssertionResult local_2c0;
  AssertHelper local_2b0;
  Message local_2a8;
  undefined4 local_29c;
  AssertionResult local_298;
  char *local_288;
  AssertHelper local_280;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  uint8_t *in_stack_fffffffffffffd98;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffda0;
  AssertHelper in_stack_fffffffffffffda8;
  Message local_250;
  AssertionResult local_248;
  AssertHelper local_238;
  Message local_230;
  AssertionResult local_228;
  AssertHelper local_218;
  Message local_210;
  undefined4 local_204;
  AssertionResult local_200;
  AssertHelper local_1f0;
  Message local_1e8;
  undefined4 local_1dc;
  AssertionResult local_1d8;
  char *local_1c8;
  char *local_1c0;
  undefined1 local_1b1;
  AssertHelper local_1b0;
  Message local_1a8;
  AssertionResult local_1a0;
  AssertHelper local_190;
  Message local_188;
  undefined4 local_17c;
  AssertionResult local_178;
  char *local_168;
  AssertHelper local_160;
  Message local_158;
  undefined4 local_14c;
  AssertionResult local_148;
  AssertHelper local_138;
  Message local_130;
  undefined4 local_124;
  AssertionResult local_120;
  undefined4 local_10c;
  AssertHelper local_108;
  Message local_100;
  undefined4 local_f4;
  AssertionResult local_f0;
  AssertHelper local_e0;
  Message local_d8;
  undefined4 local_cc;
  AssertionResult local_c8;
  undefined8 local_b8;
  int local_ac;
  string local_a8;
  AssertHelper local_88;
  Message local_80;
  undefined1 local_71;
  AssertionResult local_70;
  AssertHelper local_60;
  Message local_58 [3];
  undefined4 local_3c;
  AssertionResult local_38;
  int local_24;
  long local_20;
  char *local_18;
  char *local_10;
  
  local_10 = 
  "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}"
  ;
  local_18 = "20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac";
  local_20 = 0;
  local_24 = CfdCreateHandle(in_stack_fffffffffffffba8);
  local_3c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffba8,
             (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
             in_stack_fffffffffffffb98,(int *)in_stack_fffffffffffffb90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_38);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b28a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x2f3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message((Message *)0x3b290b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b2960);
  local_71 = local_20 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,(type *)0x3b2994);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_70,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x2f4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    testing::Message::~Message((Message *)0x3b2a90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b2b0b);
  local_ac = 0;
  local_b8 = 0;
  local_24 = CfdInitializeTaprootScriptTree
                       ((void *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
                        in_stack_fffffffffffffc70);
  local_cc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffba8,
             (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
             in_stack_fffffffffffffb98,(int *)in_stack_fffffffffffffb90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b2beb);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x2f9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message((Message *)0x3b2c4e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b2ca6);
  if (local_24 == 0) {
    local_24 = CfdSetScriptTreeFromString
                         (in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,
                          in_stack_000000af,in_stack_000000a0);
    local_f4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffba8,
               (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98,(int *)in_stack_fffffffffffffb90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
    if (!bVar1) {
      testing::Message::Message(&local_100);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b2d9a);
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x2fd,pcVar3);
      testing::internal::AssertHelper::operator=(&local_108,&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      testing::Message::~Message((Message *)0x3b2dfd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b2e55);
    local_10c = 0;
    local_24 = CfdGetTapBranchCount
                         (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                          (uint32_t *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48))
    ;
    local_124 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffba8,
               (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98,(int *)in_stack_fffffffffffffb90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
    if (!bVar1) {
      testing::Message::Message(&local_130);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b2f31);
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x301,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      testing::Message::~Message((Message *)0x3b2f94);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b2fe9);
    local_14c = 2;
    pAVar4 = &local_148;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffffba8,
               (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98,(uint *)in_stack_fffffffffffffb90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!bVar1) {
      testing::Message::Message(&local_158);
      in_stack_fffffffffffffc80 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3b3096);
      testing::internal::AssertHelper::AssertHelper
                (&local_160,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x302,in_stack_fffffffffffffc80);
      testing::internal::AssertHelper::operator=(&local_160,&local_158);
      testing::internal::AssertHelper::~AssertHelper(&local_160);
      testing::Message::~Message((Message *)0x3b30f9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b3151);
    local_168 = (char *)0x0;
    local_24 = CfdGetTaprootScriptTreeSrting
                         (pAVar4,in_stack_fffffffffffffc80,
                          (char **)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
    local_17c = 0;
    pAVar4 = &local_178;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffba8,
               (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98,(int *)in_stack_fffffffffffffb90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!bVar1) {
      testing::Message::Message(&local_188);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b322e);
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x306,pcVar3);
      testing::internal::AssertHelper::operator=(&local_190,&local_188);
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      testing::Message::~Message((Message *)0x3b3291);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b32e6);
    if (local_24 == 0) {
      pAVar4 = &local_1a0;
      testing::internal::CmpHelperSTREQ
                ((internal *)pAVar4,
                 "\"{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}\""
                 ,"tree_str",
                 "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}"
                 ,local_168);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
      if (!bVar1) {
        testing::Message::Message(&local_1a8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b3395);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x30a,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
        testing::internal::AssertHelper::~AssertHelper(&local_1b0);
        testing::Message::~Message((Message *)0x3b33f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b344d);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffb98);
      local_168 = (char *)0x0;
    }
    local_1b1 = 0;
    local_1c0 = (char *)0x0;
    local_1c8 = (char *)0x0;
    local_24 = CfdGetBaseTapLeaf(in_stack_fffffffffffffda8.data_,in_stack_fffffffffffffda0.ptr_,
                                 in_stack_fffffffffffffd98,
                                 (char **)CONCAT44(in_stack_fffffffffffffd94,
                                                   in_stack_fffffffffffffd90),
                                 (char **)in_stack_fffffffffffffd88.ptr_);
    local_1dc = 0;
    pAVar4 = &local_1d8;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffba8,
               (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98,(int *)in_stack_fffffffffffffb90);
    uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!(bool)uVar2) {
      testing::Message::Message(&local_1e8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b3569);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x314,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
      testing::internal::AssertHelper::~AssertHelper(&local_1f0);
      testing::Message::~Message((Message *)0x3b35cc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b3624);
    if (local_24 == 0) {
      local_204 = 0xc0;
      in_stack_fffffffffffffc28 = &local_200;
      testing::internal::EqHelper<false>::Compare<int,unsigned_char>
                ((char *)in_stack_fffffffffffffba8,
                 (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                 in_stack_fffffffffffffb98,&in_stack_fffffffffffffb90->success_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffc28);
      if (!bVar1) {
        testing::Message::Message(&local_210);
        in_stack_fffffffffffffc20 =
             (char **)testing::AssertionResult::failure_message((AssertionResult *)0x3b36df);
        testing::internal::AssertHelper::AssertHelper
                  (&local_218,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x316,(char *)in_stack_fffffffffffffc20);
        testing::internal::AssertHelper::operator=(&local_218,&local_210);
        testing::internal::AssertHelper::~AssertHelper(&local_218);
        testing::Message::~Message((Message *)0x3b3742);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b3797);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_228,"tapscript_str","tapscript",local_18,local_1c0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
      if (!bVar1) {
        testing::Message::Message(&local_230);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b3839);
        testing::internal::AssertHelper::AssertHelper
                  (&local_238,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x317,pcVar3);
        testing::internal::AssertHelper::operator=(&local_238,&local_230);
        testing::internal::AssertHelper::~AssertHelper(&local_238);
        testing::Message::~Message((Message *)0x3b389c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b38f1);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_248,
                 "\"4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fd\"","leaf_hash",
                 "4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fd",local_1c8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_248);
      if (!bVar1) {
        testing::Message::Message(&local_250);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b3986);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffda8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x31a,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffda8,&local_250);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffda8);
        testing::Message::~Message((Message *)0x3b39e3);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b3a38);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffb98);
      local_1c0 = (char *)0x0;
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffb98);
      local_1c8 = (char *)0x0;
    }
    local_ac = CfdFreeTaprootScriptTreeHandle
                         ((void *)CONCAT17(uVar2,in_stack_fffffffffffffc48),pAVar4);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffba8,
               (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98,(int *)in_stack_fffffffffffffb90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffd98);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffd88);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b3b29);
      testing::internal::AssertHelper::AssertHelper
                (&local_280,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x322,pcVar3);
      testing::internal::AssertHelper::operator=(&local_280,(Message *)&stack0xfffffffffffffd88);
      testing::internal::AssertHelper::~AssertHelper(&local_280);
      testing::Message::~Message((Message *)0x3b3b86);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b3bdb);
  }
  local_24 = CfdGetLastErrorCode(in_stack_fffffffffffffbc8);
  if (local_24 != 0) {
    local_288 = (char *)0x0;
    local_24 = CfdGetLastErrorMessage(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    local_29c = 0;
    pAVar4 = &local_298;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffba8,
               (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98,(int *)in_stack_fffffffffffffb90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!bVar1) {
      testing::Message::Message(&local_2a8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b3cc8);
      testing::internal::AssertHelper::AssertHelper
                (&local_2b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x329,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
      testing::internal::AssertHelper::~AssertHelper(&local_2b0);
      testing::Message::~Message((Message *)0x3b3d25);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b3d7a);
    testing::internal::CmpHelperSTREQ((internal *)&local_2c0,"\"\"","str_buffer","",local_288);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c0);
    if (!bVar1) {
      testing::Message::Message(&local_2c8);
      in_stack_fffffffffffffba8 =
           (void **)testing::AssertionResult::failure_message((AssertionResult *)0x3b3e0f);
      testing::internal::AssertHelper::AssertHelper
                (&local_2d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x32a,(char *)in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
      testing::internal::AssertHelper::~AssertHelper(&local_2d0);
      testing::Message::~Message((Message *)0x3b3e6c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b3ec1);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffb98);
    local_288 = (char *)0x0;
  }
  local_24 = CfdFreeHandle(in_stack_fffffffffffffb98);
  local_2e4 = 0;
  pAVar4 = &local_2e0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffba8,
             (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
             (CfdErrorCode *)pAVar4,(int *)in_stack_fffffffffffffb90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b3f91);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x330,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    testing::Message::~Message((Message *)0x3b3fee);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b4043);
  return;
}

Assistant:

TEST(cfdcapi_script, TapscriptTreeRestoreFromString) {
  const char* exp_tree_str = "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}";
  const char* tapscript_str = "20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int tmp_ret = 0;
  void* tree_handle1 = nullptr;
  ret = CfdInitializeTaprootScriptTree(handle, &tree_handle1);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    ret = CfdSetScriptTreeFromString(handle, tree_handle1,
        exp_tree_str, tapscript_str, 0xc0, "");
    EXPECT_EQ(kCfdSuccess, ret);

    uint32_t branch_count = 0;
    ret = CfdGetTapBranchCount(handle, tree_handle1, &branch_count);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(2, branch_count);

    char* tree_str = nullptr;
    ret = CfdGetTaprootScriptTreeSrting(handle, tree_handle1, &tree_str);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}",
        tree_str);
      CfdFreeStringBuffer(tree_str);
      tree_str = nullptr;
    }

    uint8_t leaf_version = 0;
    char* tapscript = nullptr;
    char* leaf_hash = nullptr;
    ret = CfdGetBaseTapLeaf(handle, tree_handle1,
        &leaf_version, &tapscript, &leaf_hash);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(0xc0, leaf_version);
      EXPECT_STREQ(tapscript_str, tapscript);
      EXPECT_STREQ(
        "4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fd",
        leaf_hash);
      CfdFreeStringBuffer(tapscript);
      tapscript = nullptr;
      CfdFreeStringBuffer(leaf_hash);
      leaf_hash = nullptr;
    }

    tmp_ret = CfdFreeTaprootScriptTreeHandle(handle, tree_handle1);
    EXPECT_EQ(kCfdSuccess, tmp_ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}